

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

void __thiscall
Rml::Element::SetOffset(Element *this,Vector2f offset,Element *_offset_parent,bool _offset_fixed)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  
  bVar4 = (~*(uint *)&(this->meta->computed_values).common & 0x30) == 0 || _offset_fixed;
  fVar6 = (this->relative_offset_base).x;
  if (((((fVar6 != offset.x) || (NAN(fVar6) || NAN(offset.x))) ||
       (fVar6 = (this->relative_offset_base).y, fVar6 != offset.y)) ||
      ((NAN(fVar6) || NAN(offset.y) || (this->offset_parent != _offset_parent)))) ||
     (this->offset_fixed != bVar4)) {
    this->relative_offset_base = offset;
    this->offset_fixed = bVar4;
    this->offset_parent = _offset_parent;
    UpdateOffset(this);
  }
  else {
    fVar6 = (this->relative_offset_base).x;
    fVar1 = (this->relative_offset_base).y;
    fVar2 = (this->relative_offset_position).x;
    fVar3 = (this->relative_offset_position).y;
    UpdateOffset(this);
    fVar5 = (this->relative_offset_base).x;
    if ((fVar6 == fVar5) && (!NAN(fVar6) && !NAN(fVar5))) {
      fVar6 = (this->relative_offset_base).y;
      if ((fVar1 == fVar6) && (!NAN(fVar1) && !NAN(fVar6))) {
        fVar6 = (this->relative_offset_position).x;
        if ((fVar2 == fVar6) && (!NAN(fVar2) && !NAN(fVar6))) {
          fVar6 = (this->relative_offset_position).y;
          if ((fVar3 == fVar6) && (!NAN(fVar3) && !NAN(fVar6))) {
            return;
          }
        }
      }
    }
  }
  if (this->absolute_offset_dirty != false) {
    return;
  }
  DirtyAbsoluteOffsetRecursive(this);
  return;
}

Assistant:

void Element::SetOffset(Vector2f offset, Element* _offset_parent, bool _offset_fixed)
{
	_offset_fixed |= GetPosition() == Style::Position::Fixed;

	// If our offset has definitely changed, or any of our parenting has, then these are set and
	// updated based on our left / right / top / bottom properties.
	if (relative_offset_base != offset || offset_parent != _offset_parent || offset_fixed != _offset_fixed)
	{
		relative_offset_base = offset;
		offset_fixed = _offset_fixed;
		offset_parent = _offset_parent;
		UpdateOffset();
		DirtyAbsoluteOffset();
	}

	// Otherwise, our offset is updated in case left / right / top / bottom will have an impact on
	// our final position, and our children are dirtied if they do.
	else
	{
		const Vector2f old_base = relative_offset_base;
		const Vector2f old_position = relative_offset_position;

		UpdateOffset();

		if (old_base != relative_offset_base || old_position != relative_offset_position)
			DirtyAbsoluteOffset();
	}
}